

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SelectionManager.cpp
# Opt level: O3

MoleculeStampSet * __thiscall
OpenMD::SelectionManager::getSelectedMoleculeStamps
          (MoleculeStampSet *__return_storage_ptr__,SelectionManager *this)

{
  _Rb_tree_header *p_Var1;
  Molecule *pMVar2;
  int iVar3;
  pointer pOVar4;
  Molecule *mol;
  long lVar5;
  int iVar6;
  ulong uVar7;
  long lVar8;
  MoleculeStamp *local_38;
  
  p_Var1 = &(__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_node_count = 0;
  pOVar4 = (this->ss_).bitsets_.
           super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>._M_impl.
           super__Vector_impl_data._M_start;
  lVar5 = *(long *)&pOVar4[5].bitset_.super__Bvector_base<std::allocator<bool>_>;
  if (((long)(((_Bit_iterator *)
              ((long)&pOVar4[5].bitset_.super__Bvector_base<std::allocator<bool>_> + 0x10))->
             super__Bit_iterator_base)._M_p - lVar5) * 8 +
      (ulong)*(uint *)((long)&pOVar4[5].bitset_.super__Bvector_base<std::allocator<bool>_> + 0x18)
      != 0) {
    lVar8 = 0;
    uVar7 = 0;
    do {
      iVar3 = (int)uVar7;
      iVar6 = iVar3 + 0x3f;
      if (-1 < iVar3) {
        iVar6 = iVar3;
      }
      if (((*(ulong *)(lVar5 + (long)(iVar6 >> 6) * 8 + -8 +
                      (ulong)((lVar8 >> 0x20 & 0x800000000000003fU) < 0x8000000000000001) * 8) >>
            (uVar7 & 0x3f) & 1) != 0) &&
         (pMVar2 = (this->molecules_).
                   super__Vector_base<OpenMD::Molecule_*,_std::allocator<OpenMD::Molecule_*>_>.
                   _M_impl.super__Vector_impl_data._M_start[uVar7], pMVar2 != (Molecule *)0x0)) {
        local_38 = pMVar2->molStamp_;
        std::
        _Rb_tree<OpenMD::MoleculeStamp*,OpenMD::MoleculeStamp*,std::_Identity<OpenMD::MoleculeStamp*>,OpenMD::MoleculeStampCompare,std::allocator<OpenMD::MoleculeStamp*>>
        ::_M_insert_unique<OpenMD::MoleculeStamp*>
                  ((_Rb_tree<OpenMD::MoleculeStamp*,OpenMD::MoleculeStamp*,std::_Identity<OpenMD::MoleculeStamp*>,OpenMD::MoleculeStampCompare,std::allocator<OpenMD::MoleculeStamp*>>
                    *)__return_storage_ptr__,&local_38);
        pOVar4 = (this->ss_).bitsets_.
                 super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>.
                 _M_impl.super__Vector_impl_data._M_start;
      }
      uVar7 = uVar7 + 1;
      lVar5 = *(long *)&pOVar4[5].bitset_.super__Bvector_base<std::allocator<bool>_>;
      lVar8 = lVar8 + 0x100000000;
    } while (uVar7 < (ulong)*(uint *)((long)&pOVar4[5].bitset_.
                                             super__Bvector_base<std::allocator<bool>_> + 0x18) +
                     ((long)(((_Bit_iterator *)
                             ((long)&pOVar4[5].bitset_.super__Bvector_base<std::allocator<bool>_> +
                             0x10))->super__Bit_iterator_base)._M_p - lVar5) * 8);
  }
  return __return_storage_ptr__;
}

Assistant:

MoleculeStampSet SelectionManager::getSelectedMoleculeStamps() {
    MoleculeStampSet moleculeStamps;

    for (size_t i = 0; i < ss_.bitsets_[MOLECULE].size(); ++i) {
      if (ss_.bitsets_[MOLECULE][i]) {
        // check that this processor owns this molecule
        if (molecules_[i] != NULL) {
          Molecule* mol = static_cast<Molecule*>(molecules_[i]);
          moleculeStamps.insert(mol->getMolStamp());
        }
      }
    }

#ifdef IS_MPI
    std::vector<int> foundStamps;
    MoleculeStampSet::iterator i;
    for (i = moleculeStamps.begin(); i != moleculeStamps.end(); ++i)
      foundStamps.push_back((*i)->getIdent());

    // count_local holds the number of found stamps on this processor
    int count_local = foundStamps.size();

    int nproc;
    MPI_Comm_size(MPI_COMM_WORLD, &nproc);

    // we need arrays to hold the counts and displacement vectors for
    // all processors
    std::vector<int> counts(nproc, 0);
    std::vector<int> disps(nproc, 0);

    // fill the counts array
    MPI_Allgather(&count_local, 1, MPI_INT, &counts[0], 1, MPI_INT,
                  MPI_COMM_WORLD);

    // use the processor counts to compute the displacement array
    disps[0]       = 0;
    int totalCount = counts[0];
    for (int iproc = 1; iproc < nproc; iproc++) {
      disps[iproc] = disps[iproc - 1] + counts[iproc - 1];
      totalCount += counts[iproc];
    }

    if (totalCount > 0) {
      // we need a (possibly redundant) set of all found stamps:
      std::vector<int> fsGlobal(totalCount);

      // now spray out the foundStamps to all the other processors:
      MPI_Allgatherv(&foundStamps[0], count_local, MPI_INT, &fsGlobal[0],
                     &counts[0], &disps[0], MPI_INT, MPI_COMM_WORLD);

      std::vector<int>::iterator j;

      for (j = fsGlobal.begin(); j != fsGlobal.end(); ++j)
        moleculeStamps.insert(info_->getMoleculeStamp(*j));
    }
#endif

    return moleculeStamps;
  }